

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O3

void __thiscall cppnet::RWSocket::~RWSocket(RWSocket *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  AlloterWrap *this_00;
  Dispatcher *this_01;
  _Atomic_word _Var3;
  int iVar4;
  bool bVar5;
  
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__RWSocket_001233b8;
  (this->super_CNSocket)._vptr_CNSocket = (_func_int **)&PTR__RWSocket_00123478;
  p_Var2 = (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->_read_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->_read_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_read_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  this_00 = (this->_alloter).super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if ((this_00 != (AlloterWrap *)0x0) && (this->_event != (Event *)0x0)) {
    AlloterWrap::PoolDelete<cppnet::Event>(this_00,&this->_event);
  }
  if (this->_timer_id != 0) {
    p_Var2 = (this->super_Socket)._dispatcher.
             super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0010bfcd:
      this->_timer_id = 0;
    }
    else {
      _Var3 = p_Var2->_M_use_count;
      do {
        if (_Var3 == 0) goto LAB_0010bfcd;
        LOCK();
        iVar4 = p_Var2->_M_use_count;
        bVar5 = _Var3 == iVar4;
        if (bVar5) {
          p_Var2->_M_use_count = _Var3 + 1;
          iVar4 = _Var3;
        }
        _Var3 = iVar4;
        UNLOCK();
      } while (!bVar5);
      this_01 = (this->super_Socket)._dispatcher.
                super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (this_01 != (Dispatcher *)0x0 && p_Var2->_M_use_count != 0) {
        Dispatcher::StopTimer(this_01,this->_timer_id);
      }
      this->_timer_id = 0;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  p_Var2 = (this->_block_pool).
           super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->_alloter).super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->_read_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->super_enable_shared_from_this<cppnet::RWSocket>)._M_weak_this.
           super___weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  Socket::~Socket(&this->super_Socket);
  return;
}

Assistant:

RWSocket::~RWSocket() {
    _write_buffer.reset();
    _read_buffer.reset();
    if (_alloter && _event) {
        _alloter->PoolDelete(_event);
    }
    if (_timer_id > 0) {
        auto dispatcher = GetDispatcher();
        if (dispatcher) {
            dispatcher->StopTimer(_timer_id);
        }
        _timer_id = 0;
    }
}